

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

jx9_int64 JX9StreamData_Write(void *pHandle,void *pBuf,jx9_int64 nWrite)

{
  int iVar1;
  ssize_t sVar2;
  jx9_int64 jVar3;
  jx9_stream_data *pData;
  
  jVar3 = -1;
  if ((pHandle != (void *)0x0) && (*(int *)((long)pHandle + 8) != 1)) {
    if (*(int *)((long)pHandle + 8) == 4) {
      iVar1 = (**(code **)((long)pHandle + 0x10))
                        (pBuf,nWrite & 0xffffffff,*(undefined8 *)((long)pHandle + 0x18));
      jVar3 = -1;
      if (iVar1 != -10) {
        jVar3 = nWrite;
      }
    }
    else {
      sVar2 = write(*(int *)((long)pHandle + 0x10),pBuf,nWrite);
      jVar3 = -1;
      if (0 < sVar2) {
        jVar3 = sVar2;
      }
    }
  }
  return jVar3;
}

Assistant:

static jx9_int64 JX9StreamData_Write(void *pHandle, const void *pBuf, jx9_int64 nWrite)
{
	jx9_stream_data *pData = (jx9_stream_data *)pHandle;
	if( pData == 0 ){
		return -1;
	}
	if( pData->iType == JX9_IO_STREAM_STDIN ){
		/* Forbidden */
		return -1;
	}else if( pData->iType == JX9_IO_STREAM_OUTPUT ){
		jx9_output_consumer *pCons = &pData->x.sConsumer;
		int rc;
		/* Call the vm output consumer */
		rc = pCons->xConsumer(pBuf, (unsigned int)nWrite, pCons->pUserData);
		if( rc == JX9_ABORT ){
			return -1;
		}
		return nWrite;
	}
#ifdef __WINNT__
	{
		DWORD nWr;
		BOOL rc;
		rc = WriteFile(pData->x.pHandle, pBuf, (DWORD)nWrite, &nWr, 0);
		if( !rc ){
			/* IO error */
			return -1;
		}
		return (jx9_int64)nWr;
	}
#elif defined(__UNIXES__)
	{
		ssize_t nWr;
		int fd;
		fd = SX_PTR_TO_INT(pData->x.pHandle);
		nWr = write(fd, pBuf, (size_t)nWrite);
		if( nWr < 1 ){
			return -1;
		}
		return (jx9_int64)nWr;
	}
#else
	return -1;
#endif
}